

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_view.h
# Opt level: O1

void __thiscall
bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
::reset(packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container> *this
       ,size_t width,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  
  if (this->_width != width) {
    this->_width = width;
    uVar3 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = width;
    if (width < 0x41) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 << (width & 0x3f) | 1;
        uVar2 = uVar2 + 1;
      } while (uVar2 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar1,0));
    }
    this->_field_mask = uVar3;
  }
  this->_size = size;
  uVar3 = size * this->_width;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)this,
             ((uVar3 >> 6) + 1) - (ulong)((uVar3 & 0x3f) == 0));
  return;
}

Assistant:

void reset(size_t width, size_t size) {
                assert(size == 0 || width != 0);
                
                if(width != _width) {
                    _width = width;
                    _field_mask = compute_field_mask(width);
                }
                resize(size);
            }